

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O1

optional<pbrt::BSSRDFProbeSegment> * __thiscall
pbrt::TabulatedBSSRDF::SampleSp
          (optional<pbrt::BSSRDFProbeSegment> *__return_storage_ptr__,TabulatedBSSRDF *this,Float u1
          ,Point2f u2)

{
  undefined4 uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Float FVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float local_b8;
  Float local_a8;
  float local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  
  if (0.25 <= u1) {
    uVar3._0_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.x;
    uVar3._4_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    register0x00001408 = 0;
    local_58 = uVar3;
    local_68 = (this->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    if (0.5 <= u1) {
      auVar10 = vmovshdup_avx(_local_58);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar9._8_4_ = 0x80000000;
      auVar9._0_8_ = 0x8000000080000000;
      auVar9._12_4_ = 0x80000000;
      auVar9 = vpternlogd_avx512vl(auVar18,ZEXT416((uint)local_68),auVar9,0xf8);
      fVar13 = auVar9._0_4_;
      fVar14 = -1.0 / (local_68 + fVar13);
      local_98 = auVar10._0_4_;
      fVar6 = (float)(undefined4)uVar3 * local_98 * fVar14;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)((float)(undefined4)uVar3 *
                                              (float)(undefined4)uVar3 * fVar13)),
                                ZEXT416((uint)fVar14),auVar18);
      _local_78 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar13 * fVar6)),0x10);
      local_b8 = (float)(undefined4)uVar3 * -fVar13;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)(local_98 * local_98)),ZEXT416((uint)fVar14),auVar9);
      local_98 = -local_98;
      _local_88 = vinsertps_avx(ZEXT416((uint)fVar6),auVar10,0x10);
    }
    else {
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar9 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)local_68),auVar10,0xf8);
      fVar13 = auVar9._0_4_;
      fVar14 = -1.0 / (local_68 + fVar13);
      auVar10 = vmovshdup_avx(_local_58);
      local_b8 = auVar10._0_4_;
      fVar6 = (float)(undefined4)uVar3 * local_b8 * fVar14;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)((float)(undefined4)uVar3 *
                                              (float)(undefined4)uVar3 * fVar13)),
                                ZEXT416((uint)fVar14),auVar15);
      auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar13 * fVar6)),0x10);
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(local_b8 * local_b8)),ZEXT416((uint)fVar14),auVar9);
      local_b8 = -local_b8;
      _local_78 = vinsertps_avx(ZEXT416((uint)fVar6),auVar9,0x10);
      _local_88 = _local_58;
      _local_58 = auVar10;
      local_98 = local_68;
      local_68 = (float)(undefined4)uVar3 * -fVar13;
    }
  }
  else {
    uVar2._0_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.x;
    uVar2._4_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    register0x000013c8 = 0;
    local_78 = uVar2;
    auVar10 = vmovshdup_avx(_local_78);
    local_b8 = (this->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    auVar17._8_4_ = 0x3f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar17._12_4_ = 0x3f800000;
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar9 = vpternlogd_avx512vl(auVar17,ZEXT416((uint)local_b8),auVar19,0xf8);
    fVar14 = auVar9._0_4_;
    fVar22 = -1.0 / (local_b8 + fVar14);
    fVar13 = auVar10._0_4_;
    fVar6 = (float)(undefined4)uVar2 * fVar13 * fVar22;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)((float)(undefined4)uVar2 *
                                            (float)(undefined4)uVar2 * fVar14)),
                              ZEXT416((uint)fVar22),auVar17);
    _local_88 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar14 * fVar6)),0x10);
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)(fVar13 * fVar13)),ZEXT416((uint)fVar22),auVar9);
    _local_58 = vinsertps_avx(ZEXT416((uint)fVar6),auVar10,0x10);
    local_98 = (float)(undefined4)uVar2 * -fVar14;
    local_68 = -fVar13;
  }
  local_a8 = u2.super_Tuple2<pbrt::Point2,_float>.x;
  FVar11 = SampleSr(this,local_a8);
  if ((0.0 <= FVar11) && (FVar12 = SampleSr(this,0.999), FVar11 < FVar12)) {
    auVar8._8_8_ = in_XMM1_Qb;
    auVar8._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
    auVar10 = vmovshdup_avx(auVar8);
    fVar6 = auVar10._0_4_ * 6.2831855;
    fVar13 = FVar12 * FVar12 - FVar11 * FVar11;
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      auVar10 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
      fVar13 = auVar10._0_4_;
    }
    fVar13 = fVar13 + fVar13;
    fVar14 = cosf(fVar6);
    fVar22 = sinf(fVar6);
    fVar6 = FVar11 * (fVar22 * local_98 + fVar14 * local_b8) +
            (this->po).super_Tuple3<pbrt::Point3,_float>.z + fVar13 * local_68 * -0.5;
    uVar1 = (this->po).super_Tuple3<pbrt::Point3,_float>.x;
    uVar5 = (this->po).super_Tuple3<pbrt::Point3,_float>.y;
    auVar20._0_4_ = fVar13 * (float)local_58._0_4_;
    auVar20._4_4_ = fVar13 * (float)local_58._4_4_;
    auVar20._8_4_ = fVar13 * fStack_50;
    auVar20._12_4_ = fVar13 * fStack_4c;
    auVar7._8_4_ = 0xbf000000;
    auVar7._0_8_ = 0xbf000000bf000000;
    auVar7._12_4_ = 0xbf000000;
    auVar10 = vmulps_avx512vl(auVar20,auVar7);
    auVar16._0_4_ =
         (float)uVar1 + FVar11 * (fVar14 * (float)local_78._0_4_ + fVar22 * (float)local_88._0_4_) +
         auVar10._0_4_;
    auVar16._4_4_ =
         (float)uVar5 + FVar11 * (fVar14 * (float)local_78._4_4_ + fVar22 * (float)local_88._4_4_) +
         auVar10._4_4_;
    auVar16._8_4_ = FVar11 * (fVar14 * fStack_70 + fVar22 * fStack_80) + 0.0 + auVar10._8_4_;
    auVar16._12_4_ = FVar11 * (fVar14 * fStack_6c + fVar22 * fStack_7c) + 0.0 + auVar10._12_4_;
    auVar21._0_4_ = auVar20._0_4_ + auVar16._0_4_;
    auVar21._4_4_ = auVar20._4_4_ + auVar16._4_4_;
    auVar21._8_4_ = auVar20._8_4_ + auVar16._8_4_;
    auVar21._12_4_ = auVar20._12_4_ + auVar16._12_4_;
    __return_storage_ptr__->set = true;
    uVar4 = vmovlps_avx(auVar16);
    *(undefined8 *)&__return_storage_ptr__->optionalValue = uVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar6;
    uVar4 = vmovlps_avx(auVar21);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = uVar4;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x14) = fVar13 * local_68 + fVar6;
    return __return_storage_ptr__;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSSRDFProbeSegment> SampleSp(Float u1, Point2f u2) const {
        // Choose projection axis for BSSRDF sampling
        Frame f;
        if (u1 < 0.25f)
            f = Frame::FromX(ns);
        else if (u1 < 0.5f)
            f = Frame::FromY(ns);
        else
            f = Frame::FromZ(ns);

        // Sample BSSRDF profile in polar coordinates
        Float r = SampleSr(u2[0]);
        if (r < 0)
            return {};
        Float phi = 2 * Pi * u2[1];

        // Compute BSSRDF profile bounds and intersection height
        Float r_max = SampleSr(0.999f);
        if (r >= r_max)
            return {};
        Float l = 2 * std::sqrt(Sqr(r_max) - Sqr(r));

        // Return BSSRDF sampling ray segment
        Point3f pStart =
            po + r * (f.x * std::cos(phi) + f.y * std::sin(phi)) - l * f.z * 0.5f;
        Point3f pTarget = pStart + l * f.z;
        return BSSRDFProbeSegment{pStart, pTarget};
    }